

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.cpp
# Opt level: O0

string * __thiscall
pfederc::TraitImplExpr::toString_abi_cxx11_(string *__return_storage_ptr__,TraitImplExpr *this)

{
  Token *pTVar1;
  bool bVar2;
  type caps;
  Lexer *pLVar3;
  pointer pEVar4;
  pointer this_00;
  string local_e0;
  reference local_c0;
  unique_ptr<pfederc::FuncExpr,_std::default_delete<pfederc::FuncExpr>_> *func;
  const_iterator __end1;
  const_iterator __begin1;
  list<std::unique_ptr<pfederc::FuncExpr,_std::default_delete<pfederc::FuncExpr>_>,_std::allocator<std::unique_ptr<pfederc::FuncExpr,_std::default_delete<pfederc::FuncExpr>_>_>_>
  *__range1;
  string local_80 [32];
  string local_60;
  string local_40;
  undefined1 local_19;
  TraitImplExpr *local_18;
  TraitImplExpr *this_local;
  string *result;
  
  local_19 = 0;
  local_18 = this;
  this_local = (TraitImplExpr *)__return_storage_ptr__;
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  bVar2 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&this->super_Capable);
  if (bVar2) {
    caps = std::unique_ptr<pfederc::Capabilities,_std::default_delete<pfederc::Capabilities>_>::
           operator*(&(this->super_Capable).caps);
    _capsToString_abi_cxx11_(&local_40,caps);
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_40);
    std::__cxx11::string::~string((string *)&local_40);
  }
  std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"class trait");
  bVar2 = std::
          vector<std::unique_ptr<pfederc::TemplateDecl,_std::default_delete<pfederc::TemplateDecl>_>,_std::allocator<std::unique_ptr<pfederc::TemplateDecl,_std::default_delete<pfederc::TemplateDecl>_>_>_>
          ::empty(&this->templs);
  if (!bVar2) {
    _templateToString_abi_cxx11_(&local_60,&this->templs);
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_60);
    std::__cxx11::string::~string((string *)&local_60);
  }
  std::__cxx11::string::operator+=((string *)__return_storage_ptr__,' ');
  pTVar1 = this->classTokId;
  pLVar3 = Expr::getLexer(&this->super_Expr);
  (*pTVar1->_vptr_Token[2])(local_80,pTVar1,pLVar3);
  std::__cxx11::string::operator+=((string *)__return_storage_ptr__,local_80);
  std::__cxx11::string::~string(local_80);
  std::__cxx11::string::operator+=((string *)__return_storage_ptr__,": ");
  pEVar4 = std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>::operator->
                     (&this->implTrait);
  (*pEVar4->_vptr_Expr[2])();
  std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&__range1);
  std::__cxx11::string::~string((string *)&__range1);
  std::__cxx11::string::operator+=((string *)__return_storage_ptr__,'\n');
  __end1 = std::__cxx11::
           list<std::unique_ptr<pfederc::FuncExpr,_std::default_delete<pfederc::FuncExpr>_>,_std::allocator<std::unique_ptr<pfederc::FuncExpr,_std::default_delete<pfederc::FuncExpr>_>_>_>
           ::begin(&this->functions);
  func = (unique_ptr<pfederc::FuncExpr,_std::default_delete<pfederc::FuncExpr>_> *)
         std::__cxx11::
         list<std::unique_ptr<pfederc::FuncExpr,_std::default_delete<pfederc::FuncExpr>_>,_std::allocator<std::unique_ptr<pfederc::FuncExpr,_std::default_delete<pfederc::FuncExpr>_>_>_>
         ::end(&this->functions);
  while (bVar2 = std::operator!=(&__end1,(_Self *)&func), bVar2) {
    local_c0 = std::
               _List_const_iterator<std::unique_ptr<pfederc::FuncExpr,_std::default_delete<pfederc::FuncExpr>_>_>
               ::operator*(&__end1);
    this_00 = std::unique_ptr<pfederc::FuncExpr,_std::default_delete<pfederc::FuncExpr>_>::
              operator->(local_c0);
    FuncExpr::toString_abi_cxx11_(&local_e0,this_00);
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_e0);
    std::__cxx11::string::~string((string *)&local_e0);
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,'\n');
    std::
    _List_const_iterator<std::unique_ptr<pfederc::FuncExpr,_std::default_delete<pfederc::FuncExpr>_>_>
    ::operator++(&__end1);
  }
  std::__cxx11::string::operator+=((string *)__return_storage_ptr__,';');
  return __return_storage_ptr__;
}

Assistant:

std::string TraitImplExpr::toString() const noexcept {
  std::string result;
  if (caps)
    result += _capsToString(*caps);

  result += "class trait";
  if (!templs.empty())
    result += _templateToString(templs);

  result += ' ';

  result += classTokId->toString(getLexer());
  result += ": ";
  result += implTrait->toString();
  result += '\n';

  for (auto &func : functions) {
    result += func->toString();
    result += '\n';
  }

  result += ';';

  return result;
}